

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O2

RunResult __thiscall
wabt::interp::Thread::DoSimdUnopZero<int,double>(Thread *this,UnopFunc<int,_double> *f)

{
  int iVar1;
  u8 i;
  long lVar2;
  Value value;
  Simd<double,_(unsigned_char)__x02_> SVar3;
  SR result;
  Simd<double,_(unsigned_char)__x02_> val;
  ulong local_38 [2];
  double local_28 [2];
  
  SVar3 = Pop<wabt::interp::Simd<double,(unsigned_char)2>>(this);
  local_28[0] = SVar3.v[0];
  local_28[1] = SVar3.v[1];
  for (lVar2 = 0; lVar2 != 2; lVar2 = lVar2 + 1) {
    iVar1 = (*f)(local_28[lVar2]);
    *(int *)((long)local_38 + lVar2 * 4) = iVar1;
  }
  local_38[1] = 0;
  value.field_0._8_8_ = 0;
  value.field_0.i64_ = local_38[0];
  Push(this,value);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdUnopZero(UnopFunc<R, T> f) {
  using ST = typename Simd128<T>::Type;
  using SR = typename Simd128<R>::Type;
  auto val = Pop<ST>();
  SR result;
  for (u8 i = 0; i < ST::lanes; ++i) {
    result[i] = f(val[i]);
  }
  for (u8 i = ST::lanes; i < SR::lanes; ++i) {
    result[i] = 0;
  }
  Push(result);
  return RunResult::Ok;
}